

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool verify_Board(vector<Board,_std::allocator<Board>_> *puzzles,Board *board,int posi)

{
  bool bVar1;
  reference pvVar2;
  Board local_60;
  int local_28;
  int local_24;
  int vec;
  int posi_local;
  Board *board_local;
  vector<Board,_std::allocator<Board>_> *puzzles_local;
  
  local_28 = 0;
  local_24 = posi;
  _vec = board;
  board_local = (Board *)puzzles;
  while( true ) {
    if (local_24 <= local_28) {
      return true;
    }
    pvVar2 = std::vector<Board,_std::allocator<Board>_>::operator[]
                       ((vector<Board,_std::allocator<Board>_> *)board_local,(long)local_28);
    Board::Board(&local_60,pvVar2);
    bVar1 = Board::operator==(board,&local_60);
    Board::~Board(&local_60);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool verify_Board( std::vector< Board > &puzzles, Board board, int posi )
{
    for( int vec = 0; vec < posi; vec++ )
    {
        if( board == puzzles[vec] )
        {
            return false;
        }
    }

    return true;
}